

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundFunction.cpp
# Opt level: O2

void __thiscall
Js::BoundFunction::BoundFunction(BoundFunction *this,Arguments *args,DynamicType *type)

{
  Type *this_00;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  uint uVar6;
  undefined4 *puVar7;
  Var pvVar8;
  RecyclableObject *pRVar9;
  DynamicTypeHandler *pDVar10;
  Recycler *this_01;
  WriteBarrierPtr<void> *ptr;
  long lVar11;
  uint i;
  ulong uVar12;
  ulong uVar13;
  undefined **local_68;
  Var varLength;
  ulong local_58;
  char *local_50;
  DWORD local_48;
  ScriptContext *local_40;
  ulong local_38;
  
  JavascriptFunction::JavascriptFunction
            (&this->super_JavascriptFunction,type,(FunctionInfo *)functionInfo);
  (this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_0138e5b0;
  (this->boundArgs).ptr = (WriteBarrierPtr<void> *)0x0;
  (this->targetFunction).ptr = (RecyclableObject *)0x0;
  (this->boundThis).ptr = (void *)0x0;
  this->count = 0;
  JavascriptFunction::VerifyEntryPoint(&this->super_JavascriptFunction);
  if (((ulong)args->Info & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                ,0x1c,"(args.Info.Count > 0)",
                                "wrong number of args in BoundFunction");
    if (!bVar3) goto LAB_00a05794;
    *puVar7 = 0;
  }
  this_00 = &this->targetFunction;
  pSVar1 = (((((this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.type.ptr)
             ->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  pvVar8 = Arguments::operator[](args,0);
  pRVar9 = VarTo<Js::RecyclableObject>(pvVar8);
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierSet(this_00,pRVar9);
  local_40 = pSVar1;
  BVar4 = CrossSite::NeedMarshalVar((this->targetFunction).ptr,pSVar1);
  if (BVar4 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                ,0x21,"(!CrossSite::NeedMarshalVar(targetFunction, scriptContext))",
                                "!CrossSite::NeedMarshalVar(targetFunction, scriptContext)");
    if (!bVar3) {
LAB_00a05794:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  pRVar9 = JavascriptOperators::GetPrototype(this_00->ptr);
  if (pRVar9 != (type->super_Type).prototype.ptr) {
    if (type->isShared == true) {
      DynamicObject::ChangeType((DynamicObject *)this);
      type = (DynamicType *)
             (this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.type.ptr;
    }
    Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierSet
              (&(type->super_Type).prototype,pRVar9);
  }
  pSVar1 = local_40;
  uVar12 = 0;
  BVar4 = JavascriptOperators::HasOwnProperty(this_00->ptr,0xd1,local_40,(PropertyString *)0x0);
  if (BVar4 == 1) {
    pRVar9 = this_00->ptr;
    uVar12 = 0;
    iVar5 = (*(pRVar9->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x12])
                      (pRVar9,pRVar9,0xd1,&stack0xffffffffffffff98,0,pSVar1);
    if (iVar5 == 1) {
      uVar6 = JavascriptConversion::ToInt32(local_68,pSVar1);
      uVar12 = (ulong)uVar6;
    }
  }
  pDVar10 = DynamicObject::GetTypeHandler((DynamicObject *)this);
  (*pDVar10->_vptr_DynamicTypeHandler[0x10])(pDVar10,this);
  if (((ulong)args->Info & 0xfffffe) == 0) {
    Memory::WriteBarrierPtr<void>::WriteBarrierSet
              (&this->boundThis,
               (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               undefinedValue.ptr);
    uVar6 = this->count;
  }
  else {
    pvVar8 = Arguments::operator[](args,1);
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->boundThis,pvVar8);
    uVar6 = (*(uint *)&args->Info & 0xffffff) - 2;
    this->count = uVar6;
    if (2 < (*(uint *)&args->Info & 0xffffff)) {
      local_58 = (ulong)uVar6;
      local_68 = &Memory::WriteBarrierPtr<void>::typeinfo;
      varLength = (Var)0x0;
      local_50 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
      ;
      local_48 = 0x47;
      local_38 = uVar12;
      this_01 = Memory::Recycler::TrackAllocInfo
                          (pSVar1->recycler,(TrackAllocData *)&stack0xffffffffffffff98);
      lVar11 = 0;
      ptr = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                      ((Memory *)this_01,(Recycler *)Memory::Recycler::Alloc,0,(ulong)this->count);
      Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierSet(&this->boundArgs,ptr)
      ;
      for (uVar13 = 0; uVar6 = this->count, uVar12 = local_38, uVar13 < uVar6; uVar13 = uVar13 + 1)
      {
        pvVar8 = Arguments::operator[](args,(int)uVar13 + 2);
        Memory::WriteBarrierPtr<void>::WriteBarrierSet
                  ((WriteBarrierPtr<void> *)((long)&((this->boundArgs).ptr)->ptr + lVar11),pvVar8);
        lVar11 = lVar11 + 8;
      }
    }
  }
  uVar6 = (int)uVar12 - uVar6;
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  (*(this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
    super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (this,0xd1,(ulong)uVar6 | 0x1000000000000,2,0,0,0);
  return;
}

Assistant:

BoundFunction::BoundFunction(Arguments args, DynamicType * type)
        : JavascriptFunction(type, &functionInfo),
        count(0),
        boundArgs(nullptr)
    {
        DebugOnly(VerifyEntryPoint());
        AssertMsg(args.Info.Count > 0, "wrong number of args in BoundFunction");

        ScriptContext *scriptContext = this->GetScriptContext();
        targetFunction = VarTo<RecyclableObject>(args[0]);

        Assert(!CrossSite::NeedMarshalVar(targetFunction, scriptContext));

        // Let proto be targetFunction.[[GetPrototypeOf]]().
        RecyclableObject* proto = JavascriptOperators::GetPrototype(targetFunction);
        if (proto != type->GetPrototype())
        {
            if (type->GetIsShared())
            {
                this->ChangeType();
                type = this->GetDynamicType();
            }
            type->SetPrototype(proto);
        }

        int len = 0;
        // If targetFunction is proxy, need to make sure that traps are called in right order as per 19.2.3.2 in RC#4 dated April 3rd 2015.
        // additionally need to get the correct length value for the boundFunctions' length property
        if (JavascriptOperators::HasOwnProperty(targetFunction, PropertyIds::length, scriptContext, nullptr) == TRUE)
        {
            Var varLength;
            if (targetFunction->GetProperty(targetFunction, PropertyIds::length, &varLength, nullptr, scriptContext))
            {
                len = JavascriptConversion::ToInt32(varLength, scriptContext);
            }
        }
        GetTypeHandler()->EnsureObjectReady(this);

        if (args.Info.Count > 1)
        {
            boundThis = args[1];

            // function object and "this" arg
            const uint countAccountedFor = 2;
            count = args.Info.Count - countAccountedFor;

            // Store the args excluding function obj and "this" arg
            if (args.Info.Count > 2)
            {
                boundArgs = RecyclerNewArray(scriptContext->GetRecycler(), Field(Var), count);

                for (uint i=0; i<count; i++)
                {
                    boundArgs[i] = args[i+countAccountedFor];
                }
            }
        }
        else
        {
            // If no "this" is passed, "undefined" is used
            boundThis = scriptContext->GetLibrary()->GetUndefined();
        }

        // Reduce length number of bound args
        len = len - this->count;
        len = max(len, 0);

        SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(len), PropertyConfigurable, nullptr, PropertyOperation_None, SideEffects_None);
    }